

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O0

void writeSample(uint32_t *DFD,int sampleNo,int channel,int bits,int offset,int topSample,
                int bottomSample,VkSuffix suffix)

{
  uint32_t uVar1;
  uint *puVar2;
  byte bVar3;
  int in_ECX;
  uint32_t in_EDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  int in_stack_00000008;
  VkSuffix in_stack_00000010;
  uint32_t *sample;
  anon_union_4_2_947300a4 upper;
  anon_union_4_2_947300a4 lower;
  uint local_3c;
  uint local_24;
  uint local_20;
  uint32_t local_10;
  
  puVar2 = (uint *)(in_RDI + 0x1c + (long)(in_ESI << 2) * 4);
  local_10 = in_EDX;
  if (in_EDX == 3) {
    local_10 = 0xf;
  }
  uVar1 = setChannelFlags(local_10,in_stack_00000010);
  *puVar2 = in_R8D | in_ECX * 0x10000 - 0x10000U | uVar1 << 0x18;
  puVar2[1] = 0;
  bVar3 = (byte)in_ECX;
  switch(in_stack_00000010) {
  case s_UNORM:
  case s_SRGB:
  default:
    if (in_ECX < 0x21) {
      local_24 = (1 << (bVar3 & 0x1f)) - 1;
    }
    else {
      local_24 = 0xffffffff;
    }
    local_20 = 0;
    break;
  case s_SNORM:
    if (in_ECX < 0x21) {
      if (in_R9D != 0) {
        bVar3 = bVar3 - 1;
      }
      local_3c = (1 << (bVar3 & 0x1f)) - 1;
      local_24 = local_3c;
    }
    else {
      local_24 = 0x7fffffff;
    }
    local_20 = local_24 ^ 0xffffffff;
    if (in_stack_00000008 != 0) {
      local_20 = local_20 + 1;
    }
    break;
  case s_USCALED:
  case s_UINT:
    local_24 = (uint)(in_stack_00000008 != 0);
    local_20 = 0;
    break;
  case s_SSCALED:
  case s_SINT:
    local_24 = (uint)(in_stack_00000008 != 0);
    local_20 = 0xffffffff;
    break;
  case s_SFLOAT:
    local_24 = 0x3f800000;
    local_20 = 0xbf800000;
    break;
  case s_UFLOAT:
    local_24 = 0x3f800000;
    local_20 = 0;
    break;
  case s_SFIXED5:
    if (in_ECX != 0x10) {
      __assert_fail("bits == 16 && \"Format with this suffix must be 16 bits per channel.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/dfdutils/createdfd.c"
                    ,0xa6,
                    "void writeSample(uint32_t *, int, int, int, int, int, int, enum VkSuffix)");
    }
    local_24 = 0x20;
    local_20 = 0xffffffe0;
  }
  puVar2[2] = local_20;
  puVar2[3] = local_24;
  return;
}

Assistant:

static void writeSample(uint32_t *DFD, int sampleNo, int channel,
                        int bits, int offset,
                        int topSample, int bottomSample, enum VkSuffix suffix)
{
    // Use this to avoid type-punning complaints from the gcc optimizer
    // with -Wall.
    union {
        uint32_t i;
        float f;
    } lower, upper;
    uint32_t *sample = DFD + 1 + KHR_DF_WORD_SAMPLESTART + sampleNo * KHR_DF_WORD_SAMPLEWORDS;

    if (channel == 3) channel = KHR_DF_CHANNEL_RGBSDA_ALPHA;
    channel = setChannelFlags(channel, suffix);

    sample[KHR_DF_SAMPLEWORD_BITOFFSET] =
        (offset << KHR_DF_SAMPLESHIFT_BITOFFSET) |
        ((bits - 1) << KHR_DF_SAMPLESHIFT_BITLENGTH) |
        (channel << KHR_DF_SAMPLESHIFT_CHANNELID);

    sample[KHR_DF_SAMPLEWORD_SAMPLEPOSITION_ALL] = 0;

    switch (suffix) {
    case s_UNORM:
    case s_SRGB:
    default:
        if (bits > 32) {
            upper.i = 0xFFFFFFFFU;
        } else {
            upper.i = (uint32_t)((1U << bits) - 1U);
        }
        lower.i = 0U;
        break;
    case s_SNORM:
        if (bits > 32) {
            upper.i = 0x7FFFFFFF;
        } else {
            upper.i = topSample ? (1U << (bits - 1)) - 1 : (1U << bits) - 1;
        }
        lower.i = ~upper.i;
        if (bottomSample) lower.i += 1;
        break;
    case s_USCALED:
    case s_UINT:
        upper.i = bottomSample ? 1U : 0U;
        lower.i = 0U;
        break;
    case s_SSCALED:
    case s_SINT:
        upper.i = bottomSample ? 1U : 0U;
        lower.i = ~0U;
        break;
    case s_SFLOAT:
        upper.f = 1.0f;
        lower.f = -1.0f;
        break;
    case s_UFLOAT:
        upper.f = 1.0f;
        lower.f = 0.0f;
        break;
    case s_SFIXED5:
        assert(bits == 16 && "Format with this suffix must be 16 bits per channel.");
        upper.i = 32;
        lower.i = ~upper.i + 1; // -32
    }
    sample[KHR_DF_SAMPLEWORD_SAMPLELOWER] = lower.i;
    sample[KHR_DF_SAMPLEWORD_SAMPLEUPPER] = upper.i;
}